

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasta_diff.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  size_t sVar1;
  __type _Var2;
  bool bVar3;
  uint uVar4;
  mapped_type *pmVar5;
  iterator iVar6;
  ostream *poVar7;
  _Base_ptr p_Var8;
  string *psVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  _List_node_base *p_Var10;
  long lVar11;
  char automatonState;
  allocator local_135;
  match_mode local_134;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  updated_sequences;
  anon_class_8_1_65350a3f echo_fasta_sequence;
  args_t args;
  string err;
  _Alloc_hider local_b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sequences_to_add;
  long firstSequenceLength;
  key_type local_60;
  size_t local_40;
  long output;
  
  argparse::args_t::args_t(&args,argc,argv);
  firstSequenceLength = 1;
  automatonState = '\0';
  sequences_to_add._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sequences_to_add._M_t._M_impl.super__Rb_tree_header._M_header;
  sequences_to_add._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sequences_to_add._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sequences_to_add._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sequences_to_add._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sequences_to_add._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  initAlphabets(false,(char *)0x0,true);
  local_134 = args.checks;
  if ((args.checks == sequence) && (args.op != remove)) {
    psVar9 = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string
              (psVar9,"sequence matching mode MUST also use the remove operation",(allocator *)&err)
    ;
    __cxa_throw(psVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  do {
    uVar4 = readFASTA(args.input_add,&automatonState,&names,&sequences,&nameLengths,&seqLengths,
                      &firstSequenceLength,true,(Vector *)0x0,':',1.0,false);
    sVar1 = sequences_to_add._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (uVar4 == 0) break;
    if ((uVar4 & 0xfffffffe) != 2) {
      psVar9 = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string(psVar9,"Error reading FASTA file",(allocator *)&err);
      __cxa_throw(psVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    if (local_134 == sequence) {
      std::__cxx11::string::string((string *)&err,sequences.sData,(allocator *)&local_60);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&sequences_to_add,&err);
      std::__cxx11::string::assign((char *)pmVar5);
    }
    else {
      std::__cxx11::string::string((string *)&local_60,names.sData,(allocator *)&updated_sequences);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&sequences_to_add,&local_60);
      std::__cxx11::string::string((string *)&err,(string *)pmVar5);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::string((string *)&local_60,names.sData,(allocator *)&updated_sequences);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&sequences_to_add,&local_60);
      std::__cxx11::string::assign((char *)pmVar5);
      std::__cxx11::string::~string((string *)&local_60);
      if (sVar1 == sequences_to_add._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        std::__cxx11::string::string
                  ((string *)&local_60,names.sData,(allocator *)&updated_sequences);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&sequences_to_add,&local_60);
        _Var2 = std::operator==(&err,pmVar5);
        std::__cxx11::string::~string((string *)&local_60);
        if (!_Var2) {
          __return_storage_ptr__ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
          std::__cxx11::string::string
                    ((string *)&local_60,names.sData,(allocator *)&updated_sequences);
          std::operator+(__return_storage_ptr__,&local_60,
                         " is not a unique sequence ID in the master file and different instances of this name have different sequences"
                        );
          __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                      std::__cxx11::string::~string);
        }
      }
    }
    std::__cxx11::string::~string((string *)&err);
  } while (uVar4 != 3);
  local_40 = sequences_to_add._M_t._M_impl.super__Rb_tree_header._M_node_count;
  echo_fasta_sequence.output = &output;
  output = 0;
  updated_sequences.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&updated_sequences;
  updated_sequences.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  updated_sequences.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       updated_sequences.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  do {
    uVar4 = readFASTA(args.input_master,&automatonState,&names,&sequences,&nameLengths,&seqLengths,
                      &firstSequenceLength,true,(Vector *)0x0,':',1.0,false);
    if (uVar4 == 0) break;
    if ((uVar4 & 0xfffffffe) != 2) {
      psVar9 = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string(psVar9,"Error reading FASTA file",(allocator *)&err);
      __cxa_throw(psVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    std::__cxx11::string::string((string *)&err,names.sData,(allocator *)&local_60);
    if (local_134 == sequence) {
      std::__cxx11::string::string((string *)&local_60,sequences.sData,&local_135);
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&sequences_to_add._M_t,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      if ((_Rb_tree_header *)iVar6._M_node != &sequences_to_add._M_t._M_impl.super__Rb_tree_header)
      goto LAB_00105a77;
LAB_00105ab9:
      main::anon_class_8_1_65350a3f::operator()
                (&echo_fasta_sequence,err._M_dataplus._M_p,sequences.sData,args.output);
    }
    else {
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&sequences_to_add._M_t,&err);
      if ((_Rb_tree_header *)iVar6._M_node == &sequences_to_add._M_t._M_impl.super__Rb_tree_header)
      goto LAB_00105ab9;
      if (args.checks == id_and_sequence) {
        std::__cxx11::string::string((string *)&local_60,sequences.sData,&local_135);
        bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(iVar6._M_node + 2),&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        if (!bVar3) goto LAB_00105a77;
        if (args.op != replace) {
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&updated_sequences,&err);
          if (args.op == add) {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::erase(&sequences_to_add._M_t,&err);
          }
          goto LAB_00105ab9;
        }
      }
      else {
LAB_00105a77:
        if (args.op != replace) {
          if (args.op == add) {
            main::anon_class_8_1_65350a3f::operator()
                      (&echo_fasta_sequence,err._M_dataplus._M_p,sequences.sData,args.output);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::erase(&sequences_to_add._M_t,&err);
        }
      }
    }
    std::__cxx11::string::~string((string *)&err);
  } while (uVar4 != 3);
  if (args.op != remove) {
    for (p_Var8 = sequences_to_add._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &sequences_to_add._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&err,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(p_Var8 + 1));
      main::anon_class_8_1_65350a3f::operator()
                (&echo_fasta_sequence,err._M_dataplus._M_p,local_b8._M_p,args.output);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&err);
    }
  }
  funlockfile((FILE *)args.output);
  if (args.quiet == false) {
    poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    poVar7 = std::operator<<(poVar7,"{");
    poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<(poVar7,"\'master\' :");
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    poVar7 = std::operator<<(poVar7,',');
    poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<(poVar7,"\'fasta\'  : ");
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    poVar7 = std::operator<<(poVar7,',');
    poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<(poVar7,"\'output\' : ");
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    poVar7 = std::operator<<(poVar7,',');
    poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<(poVar7,"\'non-unqiue\' : ");
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    poVar7 = std::operator<<(poVar7,',');
    poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<(poVar7,"\'duplicate\' : ");
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    poVar7 = std::operator<<(poVar7,',');
    poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
    std::operator<<(poVar7,"\'updated_sequences\' : [");
    lVar11 = 0;
    p_Var10 = (_List_node_base *)&updated_sequences;
    while (p_Var10 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var10 != (_List_node_base *)&updated_sequences) {
      std::__cxx11::string::string((string *)&err,(string *)(p_Var10 + 1));
      bVar3 = lVar11 != 0;
      lVar11 = lVar11 + -1;
      if (bVar3) {
        std::operator<<((ostream *)&std::cerr,", ");
      }
      poVar7 = std::operator<<((ostream *)&std::cerr,"\'");
      poVar7 = std::operator<<(poVar7,(string *)&err);
      std::operator<<(poVar7,"\'");
      std::__cxx11::string::~string((string *)&err);
    }
    poVar7 = std::operator<<((ostream *)&std::cerr,"]");
    poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<(poVar7,"}");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&updated_sequences.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&sequences_to_add._M_t);
  argparse::args_t::~args_t(&args);
  return 0;
}

Assistant:

int main(int argc, const char *argv[]) {
    args_t args = args_t(argc, argv);
    
    
    long firstSequenceLength = 1L;
    
    try {
        char automatonState = 0;
        // 0 - between sequences
        // 1 - reading sequence name
        // 2 - reading sequence
        
        std::map<std::string, std::string> sequences_to_add;
        
        /*auto compare_records = [&] (const std::string & id1, const char* seq_value) -> int {
            std::map<std::string, std::string>::iterator it = sequences_to_add.find (id1);
            if (it !=  sequences_to_add.end()) {
                if (args.checks == id) {
                    return 1;
                }
                return it->second == std::string (seq_value) ? 2 : 3;
            }
            return 0;
        };*/
        


        initAlphabets(false, NULL, true);
        long non_unique_ids = 0;
        bool sequence_deduplication = false;
      
      if (args.checks == argparse::sequence) {
        if (args.op == argparse::remove) {
          sequence_deduplication = true;
        } else {
          throw (std::string ("sequence matching mode MUST also use the remove operation"));
        }
      }
      

        while (long state = readFASTA(args.input_add, automatonState, names, sequences, nameLengths,
                         seqLengths, firstSequenceLength, true)) { // read sequences one by one
            
            if (state == 2 || state == 3) {
                if (sequence_deduplication) {
                  // for this run mode, the map is inverted : sequence  -->  ID
                  sequences_to_add[sequences.getString()] = names.getString();
                } else {
                  long current_size = sequences_to_add.size();
                  std::string check_existing = sequences_to_add[names.getString()];
                  sequences_to_add[names.getString()] = sequences.getString();
                  if (current_size == sequences_to_add.size()) {
                      if (check_existing == sequences_to_add[names.getString()]) {
                          //cerr << std::string (names.getString()) + " is not a unique sequence ID in the master file" << endl;
                          non_unique_ids++;
                      } else {
                          throw (std::string (names.getString()) + " is not a unique sequence ID in the master file and different instances of this name have different sequences");
                      }
                  }
                }
                
                if (state == 3) {
                    break;
                }
            } else {
                throw (std::string ("Error reading FASTA file"));
            }
            //dump_fasta (sequences.getString(), firstSequenceLength, stdout);
        }
        
        long sequences_to_add_count = sequences_to_add.size(),
             duplicates = 0L,
             master_sequences = 0L,
             output = 0L;

        auto echo_fasta_sequence = [&] (const char* id, const char* data, FILE * where) -> void {
            output ++;
            fprintf (where, ">%s\n%s\n", id, data);
        };


        /*
         scan master records one by one;
         output those that are not present in sequences_to_add
         those that are present in sequences_to_add will be
        */
        
        std::list <std::string> updated_sequences;
        
        while (long state = readFASTA(args.input_master, automatonState, names, sequences, nameLengths, seqLengths, firstSequenceLength, true)) {
            if (state == 2 || state == 3) {
                std::string master_id (names.getString());
                //cerr << master_id << endl;
                master_sequences++;
              
                bool records_different,
                     ids_different;
                if (!sequence_deduplication) {
                  auto it = sequences_to_add.find (master_id);
                  ids_different = it == sequences_to_add.end();
                  
                  if (ids_different) {
                      records_different = true;
                  } else {
                      if (args.checks == argparse::id_and_sequence) {
                          records_different = it->second != std::string (sequences.getString());
                      } else {
                          records_different = false;
                      }
                  }
                } else {
                  ids_different = true;
                  auto it = sequences_to_add.find (sequences.getString());
                  records_different = it == sequences_to_add.end();
                }
                
                //cout << records_different << " " << ids_different << endl;
                
                if (!records_different) { // not unique
                    duplicates++;
                    if (args.op == argparse::replace) {
                        if (state == 3) {
                            break;
                        }
                        continue;
                    }
                    if (args.op == argparse::add) {
                        echo_fasta_sequence (master_id.c_str(), sequences.getString(), args.output);
                    }
                    sequences_to_add.erase (master_id);
                } else {
                    if (ids_different || args.op != argparse::replace) {
                        if (!ids_different) {
                            updated_sequences.push_back (master_id);
                            if (args.op == argparse::add) {
                                sequences_to_add.erase (master_id);
                            }
                        }
                        echo_fasta_sequence (master_id.c_str(), sequences.getString(), args.output);
                    }
                }
                
                if (state == 3) {
                    break;
                }
            } else {
                throw (std::string ("Error reading FASTA file"));
            }
        }
                
                // now output remaining sequences from the FASTA file
        
        if (args.op != argparse::remove) {
            for (std::pair<std::string, std::string> it : sequences_to_add) {
                echo_fasta_sequence (it.first.c_str(), it.second.c_str(), args.output);
            }
        }
        funlockfile (args.output);

        if (!args.quiet) {
            cerr << endl << "{" << endl << "'master' :" << master_sequences << ',' << endl <<
                      "'fasta'  : " << sequences_to_add_count << ',' << endl <<
                      "'output' : " << output << ',' << endl <<
                      "'non-unqiue' : " << non_unique_ids << ',' << endl <<
                      "'duplicate' : " << duplicates << ',' << endl <<
                      "'updated_sequences' : [";
            
            long k = 0;
            for (std::string s : updated_sequences) {
                if (k) {
                    cerr << ", ";
                }
                cerr << "'" << s << "'";
                k++;
            }
            cerr << "]" << endl << "}" << endl;
        }
        
        /*
        if (!args.quiet) {
            cerr << "Read " << sequences_to_add.size() << " sequences from the FASTA file" << endl;
        }*/

    } catch (const std::string err) {
        cerr << "ERROR: " << err << endl;
        return 1;
    }
    
    return 0;
}